

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::AddPageToZeroQueue
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,void *address,uint pageCount,
          PageSegmentBase<Memory::VirtualAllocWrapper> *pageSegment)

{
  undefined4 *puVar1;
  PageAllocatorBaseCommon *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  bVar4 = HasZeroPageQueue(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6c4,"(HasZeroPageQueue())","HasZeroPageQueue()");
    if (!bVar4) goto LAB_0025187c;
    *puVar1 = 0;
  }
  pPVar2 = (pageSegment->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
           allocator;
  if (pPVar2 == (PageAllocatorBaseCommon *)0x0 ||
      (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
       *)&pPVar2[-1].allocatorType != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6c5,"(pageSegment->GetAllocator() == this)",
                       "pageSegment->GetAllocator() == this");
    if (!bVar4) {
LAB_0025187c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  *(PageSegmentBase<Memory::VirtualAllocWrapper> **)((long)address + 8) = pageSegment;
  *(uint *)((long)address + 0x10) = pageCount;
  ZeroPageQueue::PushZeroPageEntry
            ((ZeroPageQueue *)this->backgroundPageQueue,(FreePageEntry *)address);
  this->hasZeroQueuedPages = true;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AddPageToZeroQueue(__in void * address, uint pageCount, __in TPageSegment * pageSegment)
{
    Assert(HasZeroPageQueue());
    Assert(pageSegment->GetAllocator() == this);
    FreePageEntry * entry = (FreePageEntry *)address;
    entry->segment = pageSegment;
    entry->pageCount = pageCount;
    ((ZeroPageQueue *)backgroundPageQueue)->PushZeroPageEntry(entry);
    this->hasZeroQueuedPages = true;
}